

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_read_cbd(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                     opj_event_mgr *p_manager)

{
  undefined8 in_RAX;
  OPJ_BYTE *p_buffer;
  OPJ_UINT32 OVar1;
  OPJ_UINT32 *pOVar2;
  OPJ_UINT32 l_comp_def;
  OPJ_UINT32 l_nb_comp;
  undefined8 local_38;
  
  OVar1 = p_j2k->m_private_image->numcomps;
  if (OVar1 + 2 == p_header_size) {
    local_38 = in_RAX;
    opj_read_bytes_LE(p_header_data,(OPJ_UINT32 *)((long)&local_38 + 4),2);
    if (local_38._4_4_ == OVar1) {
      if (OVar1 != 0) {
        p_buffer = p_header_data + 2;
        pOVar2 = &p_j2k->m_private_image->comps->sgnd;
        do {
          opj_read_bytes_LE(p_buffer,(OPJ_UINT32 *)&local_38,1);
          p_buffer = p_buffer + 1;
          *pOVar2 = (uint)local_38 >> 7 & 1;
          pOVar2[-2] = ((uint)local_38 & 0x7f) + 1;
          pOVar2 = pOVar2 + 0xe;
          OVar1 = OVar1 - 1;
        } while (OVar1 != 0);
        return 1;
      }
      return 1;
    }
  }
  opj_event_msg_v2(p_manager,1,"Crror reading CBD marker\n");
  return 0;
}

Assistant:

opj_bool j2k_read_cbd (	opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager)
{
	OPJ_UINT32 l_nb_comp,l_num_comp;
	OPJ_UINT32 l_comp_def;
	OPJ_UINT32 i;
	opj_image_comp_t * l_comp = 00;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_num_comp = p_j2k->m_private_image->numcomps;

	if (p_header_size != (p_j2k->m_private_image->numcomps + 2)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Crror reading CBD marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_nb_comp,2);				/* Ncbd */
	p_header_data+=2;

	if (l_nb_comp != l_num_comp) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Crror reading CBD marker\n");
		return OPJ_FALSE;
	}

	l_comp = p_j2k->m_private_image->comps;
	for (i=0;i<l_num_comp;++i) {
		opj_read_bytes(p_header_data,&l_comp_def,1);			/* Component bit depth */
		++p_header_data;
        l_comp->sgnd = (l_comp_def>>7) & 1;
		l_comp->prec = (l_comp_def&0x7f) + 1;
		++l_comp;
	}

	return OPJ_TRUE;
}